

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

ON_2dPoint __thiscall
ON_OBSOLETE_V5_DimRadial::Dim2dPoint(ON_OBSOLETE_V5_DimRadial *this,int point_index)

{
  ON_2dPoint *pOVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  ON_2dPoint OVar5;
  ON_2dPoint OVar6;
  
  dVar3 = -1.23432101234321e+308;
  if ((-1 < point_index) &&
     (3 < (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count)
     ) {
    uVar2 = 2;
    if (point_index != 10000) {
      uVar2 = point_index;
    }
    dVar4 = -1.23432101234321e+308;
    if ((int)uVar2 < 4) {
      pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a
      ;
      dVar3 = pOVar1[uVar2].x;
      dVar4 = pOVar1[uVar2].y;
    }
    OVar5.y = dVar4;
    OVar5.x = dVar3;
    return OVar5;
  }
  OVar6.y = -1.23432101234321e+308;
  OVar6.x = -1.23432101234321e+308;
  return OVar6;
}

Assistant:

ON_2dPoint ON_OBSOLETE_V5_DimRadial::Dim2dPoint(
      int point_index
      ) const
{
  ON_2dPoint p2;
  if ( m_points.Count() < dim_pt_count || point_index < 0 )
  {
    p2.x = p2.y = ON_UNSET_VALUE;
  }
  else
  {
    if ( text_pivot_pt == point_index )
    {
      point_index = tail_pt_index;
    }
    if ( point_index < dim_pt_count )
    {
      p2 = m_points[point_index];
    }    
    else
    {
      p2.x = p2.y = ON_UNSET_VALUE;
    }
  }
  return p2;
}